

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux.c
# Opt level: O0

int uv_interface_addresses(uv_interface_address_t **addresses,int *count)

{
  undefined8 *puVar1;
  long lVar2;
  int iVar3;
  int *piVar4;
  void *pvVar5;
  char *pcVar6;
  size_t __n;
  size_t namelen;
  sockaddr_ll *sll;
  long *plStack_38;
  int i;
  uv_interface_address_t *address;
  ifaddrs *ent;
  ifaddrs *addrs;
  int *count_local;
  uv_interface_address_t **addresses_local;
  
  *count = 0;
  *addresses = (uv_interface_address_t *)0x0;
  addrs = (ifaddrs *)count;
  count_local = (int *)addresses;
  iVar3 = getifaddrs(&ent);
  if (iVar3 == 0) {
    for (address = (uv_interface_address_t *)ent; address != (uv_interface_address_t *)0x0;
        address = (uv_interface_address_t *)address->name) {
      iVar3 = uv__ifaddr_exclude((ifaddrs *)address,1);
      if (iVar3 == 0) {
        *(int *)&addrs->ifa_next = *(int *)&addrs->ifa_next + 1;
      }
    }
    if (*(int *)&addrs->ifa_next == 0) {
      freeifaddrs(ent);
      addresses_local._4_4_ = 0;
    }
    else {
      pvVar5 = uv__calloc((long)*(int *)&addrs->ifa_next,0x50);
      *(void **)count_local = pvVar5;
      if (*(long *)count_local == 0) {
        freeifaddrs(ent);
        addresses_local._4_4_ = -0xc;
      }
      else {
        plStack_38 = *(long **)count_local;
        for (address = (uv_interface_address_t *)ent; address != (uv_interface_address_t *)0x0;
            address = (uv_interface_address_t *)address->name) {
          iVar3 = uv__ifaddr_exclude((ifaddrs *)address,1);
          if (iVar3 == 0) {
            pcVar6 = uv__strdup(*(char **)address->phys_addr);
            *plStack_38 = (long)pcVar6;
            if (**(short **)((long)&address->address + 4) == 10) {
              puVar1 = *(undefined8 **)((long)&address->address + 4);
              *(undefined8 *)((long)plStack_38 + 0x14) = *puVar1;
              *(undefined8 *)((long)plStack_38 + 0x1c) = puVar1[1];
              *(undefined8 *)((long)plStack_38 + 0x24) = puVar1[2];
              *(undefined4 *)((long)plStack_38 + 0x2c) = *(undefined4 *)(puVar1 + 3);
            }
            else {
              puVar1 = *(undefined8 **)((long)&address->address + 4);
              *(undefined8 *)((long)plStack_38 + 0x14) = *puVar1;
              *(undefined8 *)((long)plStack_38 + 0x1c) = puVar1[1];
            }
            if (**(short **)((long)&address->address + 0xc) == 10) {
              puVar1 = *(undefined8 **)((long)&address->address + 0xc);
              plStack_38[6] = *puVar1;
              plStack_38[7] = puVar1[1];
              plStack_38[8] = puVar1[2];
              *(undefined4 *)(plStack_38 + 9) = *(undefined4 *)(puVar1 + 3);
            }
            else {
              puVar1 = *(undefined8 **)((long)&address->address + 0xc);
              plStack_38[6] = *puVar1;
              plStack_38[7] = puVar1[1];
            }
            *(uint *)(plStack_38 + 2) = (uint)((address->is_internal & 8U) != 0);
            plStack_38 = plStack_38 + 10;
          }
        }
        for (address = (uv_interface_address_t *)ent; address != (uv_interface_address_t *)0x0;
            address = (uv_interface_address_t *)address->name) {
          iVar3 = uv__ifaddr_exclude((ifaddrs *)address,0);
          if (iVar3 == 0) {
            plStack_38 = *(long **)count_local;
            for (sll._4_4_ = 0; sll._4_4_ < *(int *)&addrs->ifa_next; sll._4_4_ = sll._4_4_ + 1) {
              __n = strlen(*(char **)address->phys_addr);
              iVar3 = strncmp((char *)*plStack_38,*(char **)address->phys_addr,__n);
              if ((iVar3 == 0) &&
                 ((*(char *)(*plStack_38 + __n) == '\0' || (*(char *)(*plStack_38 + __n) == ':'))))
              {
                lVar2 = *(long *)((long)&address->address + 4);
                *(undefined4 *)(plStack_38 + 1) = *(undefined4 *)(lVar2 + 0xc);
                *(undefined2 *)((long)plStack_38 + 0xc) = *(undefined2 *)(lVar2 + 0x10);
              }
              plStack_38 = plStack_38 + 10;
            }
          }
        }
        freeifaddrs(ent);
        addresses_local._4_4_ = 0;
      }
    }
  }
  else {
    piVar4 = __errno_location();
    addresses_local._4_4_ = -*piVar4;
  }
  return addresses_local._4_4_;
}

Assistant:

int uv_interface_addresses(uv_interface_address_t** addresses, int* count) {
  struct ifaddrs *addrs, *ent;
  uv_interface_address_t* address;
  int i;
  struct sockaddr_ll *sll;

  *count = 0;
  *addresses = NULL;

  if (getifaddrs(&addrs))
    return UV__ERR(errno);

  /* Count the number of interfaces */
  for (ent = addrs; ent != NULL; ent = ent->ifa_next) {
    if (uv__ifaddr_exclude(ent, UV__EXCLUDE_IFADDR))
      continue;

    (*count)++;
  }

  if (*count == 0) {
    freeifaddrs(addrs);
    return 0;
  }

  /* Make sure the memory is initiallized to zero using calloc() */
  *addresses = uv__calloc(*count, sizeof(**addresses));
  if (!(*addresses)) {
    freeifaddrs(addrs);
    return UV_ENOMEM;
  }

  address = *addresses;

  for (ent = addrs; ent != NULL; ent = ent->ifa_next) {
    if (uv__ifaddr_exclude(ent, UV__EXCLUDE_IFADDR))
      continue;

    address->name = uv__strdup(ent->ifa_name);

    if (ent->ifa_addr->sa_family == AF_INET6) {
      address->address.address6 = *((struct sockaddr_in6*) ent->ifa_addr);
    } else {
      address->address.address4 = *((struct sockaddr_in*) ent->ifa_addr);
    }

    if (ent->ifa_netmask->sa_family == AF_INET6) {
      address->netmask.netmask6 = *((struct sockaddr_in6*) ent->ifa_netmask);
    } else {
      address->netmask.netmask4 = *((struct sockaddr_in*) ent->ifa_netmask);
    }

    address->is_internal = !!(ent->ifa_flags & IFF_LOOPBACK);

    address++;
  }

  /* Fill in physical addresses for each interface */
  for (ent = addrs; ent != NULL; ent = ent->ifa_next) {
    if (uv__ifaddr_exclude(ent, UV__EXCLUDE_IFPHYS))
      continue;

    address = *addresses;

    for (i = 0; i < (*count); i++) {
      size_t namelen = strlen(ent->ifa_name);
      /* Alias interface share the same physical address */
      if (strncmp(address->name, ent->ifa_name, namelen) == 0 &&
          (address->name[namelen] == 0 || address->name[namelen] == ':')) {
        sll = (struct sockaddr_ll*)ent->ifa_addr;
        memcpy(address->phys_addr, sll->sll_addr, sizeof(address->phys_addr));
      }
      address++;
    }
  }

  freeifaddrs(addrs);

  return 0;
}